

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O2

void testCopyDeepScanLine(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_a902a::readCopyWriteTest(tempDir,1,100);
  anon_unknown.dwarf_a902a::readCopyWriteTest(tempDir,3,0x32);
  anon_unknown.dwarf_a902a::readCopyWriteTest(tempDir,10,10);
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testCopyDeepScanLine (const std::string& tempDir)
{
    try
    {
        cout << "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n"
             << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        readCopyWriteTest (tempDir, 1, 100);
        readCopyWriteTest (tempDir, 3, 50);
        readCopyWriteTest (tempDir, 10, 10);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}